

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool InlineStyle(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Bool BVar1;
  ctmbstr local_38;
  ctmbstr CSSeq;
  Node *child;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  child = (Node *)pnode;
  pnode_local = &node->parent;
  node_local = &doc->root;
  BVar1 = CanApplyInlineStyle(node);
  if (BVar1 != no) {
    CSSeq = (ctmbstr)pnode_local[3];
    if ((Node *)CSSeq == (Node *)0x0) {
      return no;
    }
    if (((Node *)CSSeq)->next != (Node *)0x0) {
      return no;
    }
    BVar1 = FindCSSSpanEq((Node *)CSSeq,&local_38,no);
    if (BVar1 != no) {
      MergeStyles((TidyDocImpl *)node_local,(Node *)pnode_local,(Node *)CSSeq);
      prvTidyAddStyleProperty((TidyDocImpl *)node_local,(Node *)pnode_local,local_38);
      StripOnlyChild((TidyDocImpl *)node_local,(Node *)pnode_local);
      return yes;
    }
    if (((CSSeq != (ctmbstr)0x0) && (*(long *)(CSSeq + 0x38) != 0)) &&
       (**(int **)(CSSeq + 0x38) == 0x24)) {
      MergeStyles((TidyDocImpl *)node_local,(Node *)pnode_local,(Node *)CSSeq);
      AddFontStyles((TidyDocImpl *)node_local,(Node *)pnode_local,*(AttVal **)(CSSeq + 0x28));
      StripOnlyChild((TidyDocImpl *)node_local,(Node *)pnode_local);
      return yes;
    }
  }
  return no;
}

Assistant:

static Bool InlineStyle( TidyDocImpl* doc, Node *node, Node **ARG_UNUSED(pnode) )
{
    Node *child;
    ctmbstr CSSeq;

    if ( CanApplyInlineStyle(node) )
    {
        child = node->content;

        if (child == NULL)
            return no;

        /* check child has no peers */

        if (child->next)
            return no;

        if ( FindCSSSpanEq(child, &CSSeq, no) )
        {
            MergeStyles( doc, node, child );
            TY_(AddStyleProperty)( doc, node, CSSeq );
            StripOnlyChild( doc, node );
            return yes;
        }
        else if ( nodeIsFONT(child) )
        {
            MergeStyles( doc, node, child );
            AddFontStyles( doc, node, child->attributes );
            StripOnlyChild( doc, node );
            return yes;
        }
    }

    return no;
}